

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O0

void Cbs0_ManSaveModel(Cbs0_Man_t *p,Vec_Int_t *vCex)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pVar;
  Vec_Int_t *vCex_local;
  Cbs0_Man_t *p_local;
  
  Vec_IntClear(vCex);
  (p->pProp).iHead = 0;
  local_24 = (p->pProp).iHead;
  while( true ) {
    bVar3 = false;
    if (local_24 < (p->pProp).iTail) {
      pGStack_20 = (p->pProp).pData[local_24];
      bVar3 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsCi(pGStack_20);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjCioId(pGStack_20);
      iVar2 = Cbs0_VarValue(pGStack_20);
      iVar1 = Abc_Var2Lit(iVar1,(uint)((iVar2 != 0 ^ 0xffU) & 1));
      Vec_IntPush(vCex,iVar1);
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

static inline void Cbs0_ManSaveModel( Cbs0_Man_t * p, Vec_Int_t * vCex )
{
    Gia_Obj_t * pVar;
    int i;
    Vec_IntClear( vCex );
    p->pProp.iHead = 0;
    Cbs0_QueForEachEntry( p->pProp, pVar, i )
        if ( Gia_ObjIsCi(pVar) )
//            Vec_IntPush( vCex, Abc_Var2Lit(Gia_ObjId(p->pAig,pVar), !Cbs0_VarValue(pVar)) );
            Vec_IntPush( vCex, Abc_Var2Lit(Gia_ObjCioId(pVar), !Cbs0_VarValue(pVar)) );
}